

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O1

void M_Unlock(Matrix *M)

{
  int iVar1;
  
  if ((M != (Matrix *)0x0) &&
     (iVar1 = M->LockLevel, M->LockLevel = iVar1 + -1, iVar1 < 2 && M->Instance == Tempor)) {
    M_Destr(M);
    free(M);
    return;
  }
  return;
}

Assistant:

void M_Unlock(Matrix *M)
/* unlock the matrix M */
{
    if (M != NULL) {
        M->LockLevel--;
        if (M->Instance == Tempor && M->LockLevel <= 0) {
            M_Destr(M); 
	    free(M);
	}
    }
}